

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Am_Drawonable *d)

{
  char *pcVar1;
  ostream *poVar2;
  void *pvVar3;
  Am_Drawonable *d_local;
  ostream *os_local;
  
  if (d == (Am_Drawonable *)0x0) {
    std::operator<<(os,"(0L) Drawonable");
  }
  else {
    pcVar1 = Am_Drawonable::Get_Title(d);
    std::operator<<(os,pcVar1);
  }
  poVar2 = std::operator<<(os," (");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::hex);
  pvVar3 = (void *)std::ostream::operator<<(pvVar3,d);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::dec);
  std::operator<<(poVar2,")");
  return os;
}

Assistant:

std::ostream &
operator<<(std::ostream &os, Am_Drawonable *d)
{
  if (d)
    os << d->Get_Title();
  else
    os << "(0L) Drawonable";
  os << " (" << std::hex << (void *)d << std::dec << ")";
  return os;
}